

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.h
# Opt level: O2

bool qFuzzyCompare(QPointF *p1,QPointF *p2)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  double dVar4;
  
  dVar4 = p1->xp;
  dVar1 = p2->xp;
  if (((dVar4 == 0.0) && (!NAN(dVar4))) || ((dVar1 == 0.0 && (!NAN(dVar1))))) {
    dVar4 = dVar4 - dVar1;
    uVar3 = -(ulong)(dVar4 < -dVar4);
    if ((double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3) <= 1e-12) goto LAB_00283b29;
  }
  else {
    bVar2 = qFuzzyCompare(dVar4,dVar1);
    if (bVar2) {
LAB_00283b29:
      dVar4 = p1->yp;
      dVar1 = p2->yp;
      if (((dVar4 != 0.0) || (NAN(dVar4))) && ((dVar1 != 0.0 || (NAN(dVar1))))) {
        bVar2 = qFuzzyCompare(dVar4,dVar1);
        return bVar2;
      }
      dVar4 = dVar4 - dVar1;
      uVar3 = -(ulong)(dVar4 < -dVar4);
      return (double)(~uVar3 & (ulong)dVar4 | (ulong)-dVar4 & uVar3) <= 1e-12;
    }
  }
  return false;
}

Assistant:

constexpr bool qFuzzyCompare(const QPointF &p1, const QPointF &p2) noexcept
    {
        return ((!p1.xp || !p2.xp) ? qFuzzyIsNull(p1.xp - p2.xp) : qFuzzyCompare(p1.xp, p2.xp))
            && ((!p1.yp || !p2.yp) ? qFuzzyIsNull(p1.yp - p2.yp) : qFuzzyCompare(p1.yp, p2.yp));
    }